

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

Transform * __thiscall sf::Transform::combine(Transform *this,Transform *transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float *a;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar1 = transform->m_matrix[0];
  fVar2 = transform->m_matrix[1];
  fVar3 = transform->m_matrix[3];
  fVar4 = transform->m_matrix[4];
  fVar5 = transform->m_matrix[5];
  fVar6 = transform->m_matrix[7];
  fVar7 = transform->m_matrix[0xc];
  fVar8 = transform->m_matrix[0xd];
  fVar9 = transform->m_matrix[0xf];
  fVar10 = this->m_matrix[3];
  fVar11 = this->m_matrix[7];
  fVar12 = this->m_matrix[0xf];
  fVar17 = (float)*(undefined8 *)(this->m_matrix + 4);
  fVar18 = (float)((ulong)*(undefined8 *)(this->m_matrix + 4) >> 0x20);
  fVar15 = (float)*(undefined8 *)this->m_matrix;
  fVar16 = (float)((ulong)*(undefined8 *)this->m_matrix >> 0x20);
  fVar13 = (float)*(undefined8 *)(this->m_matrix + 0xc);
  fVar14 = (float)((ulong)*(undefined8 *)(this->m_matrix + 0xc) >> 0x20);
  *(ulong *)this->m_matrix =
       CONCAT44(fVar3 * fVar14 + fVar1 * fVar16 + fVar2 * fVar18,
                fVar3 * fVar13 + fVar1 * fVar15 + fVar2 * fVar17);
  this->m_matrix[2] = 0.0;
  this->m_matrix[3] = fVar12 * fVar3 + fVar10 * fVar1 + fVar2 * fVar11;
  *(ulong *)(this->m_matrix + 4) =
       CONCAT44(fVar6 * fVar14 + fVar4 * fVar16 + fVar5 * fVar18,
                fVar6 * fVar13 + fVar4 * fVar15 + fVar5 * fVar17);
  this->m_matrix[6] = 0.0;
  this->m_matrix[7] = fVar12 * fVar6 + fVar10 * fVar4 + fVar5 * fVar11;
  this->m_matrix[8] = 0.0;
  this->m_matrix[9] = 0.0;
  this->m_matrix[10] = 1.0;
  this->m_matrix[0xb] = 0.0;
  *(ulong *)(this->m_matrix + 0xc) =
       CONCAT44(fVar9 * fVar14 + fVar7 * fVar16 + fVar8 * fVar18,
                fVar9 * fVar13 + fVar7 * fVar15 + fVar8 * fVar17);
  this->m_matrix[0xe] = 0.0;
  this->m_matrix[0xf] = fVar12 * fVar9 + fVar10 * fVar7 + fVar11 * fVar8;
  return this;
}

Assistant:

Transform& Transform::combine(const Transform& transform)
{
    const float* a = m_matrix;
    const float* b = transform.m_matrix;

    *this = Transform(a[0] * b[0]  + a[4] * b[1]  + a[12] * b[3],
                      a[0] * b[4]  + a[4] * b[5]  + a[12] * b[7],
                      a[0] * b[12] + a[4] * b[13] + a[12] * b[15],
                      a[1] * b[0]  + a[5] * b[1]  + a[13] * b[3],
                      a[1] * b[4]  + a[5] * b[5]  + a[13] * b[7],
                      a[1] * b[12] + a[5] * b[13] + a[13] * b[15],
                      a[3] * b[0]  + a[7] * b[1]  + a[15] * b[3],
                      a[3] * b[4]  + a[7] * b[5]  + a[15] * b[7],
                      a[3] * b[12] + a[7] * b[13] + a[15] * b[15]);

    return *this;
}